

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShellLinkAndJumpListHandler.cpp
# Opt level: O2

void __thiscall
ShellLinkAndJumpListHandler::ShellLinkAndJumpListHandler
          (ShellLinkAndJumpListHandler *this,string *filePath)

{
  bool bVar1;
  ostream *poVar2;
  ReadStream *this_00;
  string sStack_38;
  
  *(undefined8 *)((long)&this->countOfShellLink + 1) = 0;
  this->countOfShellLinkWithErrors = 0;
  this->countOfShellLink = 0;
  poVar2 = std::operator<<((ostream *)&std::cout,"File:                               ");
  poVar2 = std::operator<<(poVar2,(string *)filePath);
  poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
  std::endl<char,std::char_traits<char>>(poVar2);
  this_00 = (ReadStream *)operator_new(0x210);
  std::__cxx11::string::string((string *)&sStack_38,(string *)filePath);
  ReadStream::ReadStream(this_00,&sStack_38);
  this->rs = this_00;
  std::__cxx11::string::~string((string *)&sStack_38);
  bVar1 = ReadStream::isFileOpen(this->rs);
  if (bVar1) {
    this->fileIsOpen = true;
  }
  return;
}

Assistant:

ShellLinkAndJumpListHandler::ShellLinkAndJumpListHandler(std::string filePath) {
    cout << "File:                               " << filePath << endl << endl;
    rs = new ReadStream(filePath);
    if(rs->isFileOpen())
        fileIsOpen = true;
}